

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O2

mpc_parser_t * mpc_or(int n,...)

{
  char in_AL;
  mpc_parser_t *pmVar1;
  void *pvVar2;
  uint uVar3;
  undefined8 in_RCX;
  undefined8 in_RDX;
  ulong uVar4;
  undefined8 in_RSI;
  undefined8 *puVar5;
  ulong uVar6;
  undefined8 *puVar7;
  undefined8 in_R8;
  undefined8 in_R9;
  ulong uVar8;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list va;
  undefined8 local_d8 [4];
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  
  if (in_AL != '\0') {
    local_a8 = in_XMM0_Qa;
    local_98 = in_XMM1_Qa;
    local_88 = in_XMM2_Qa;
    local_78 = in_XMM3_Qa;
    local_68 = in_XMM4_Qa;
    local_58 = in_XMM5_Qa;
    local_48 = in_XMM6_Qa;
    local_38 = in_XMM7_Qa;
  }
  local_d8[1] = in_RSI;
  local_d8[2] = in_RDX;
  local_d8[3] = in_RCX;
  local_b8 = in_R8;
  local_b0 = in_R9;
  pmVar1 = mpc_undefined();
  pmVar1->type = '\x17';
  (pmVar1->data).repeat.n = n;
  pvVar2 = malloc((long)n * 8);
  (pmVar1->data).lift.x = pvVar2;
  puVar5 = (undefined8 *)&stack0x00000008;
  uVar3 = 8;
  uVar4 = 0;
  uVar8 = (ulong)(uint)n;
  if (n < 1) {
    uVar8 = uVar4;
  }
  for (; uVar8 != uVar4; uVar4 = uVar4 + 1) {
    if (uVar3 < 0x29) {
      uVar6 = (ulong)uVar3;
      uVar3 = uVar3 + 8;
      puVar7 = (undefined8 *)((long)local_d8 + uVar6);
    }
    else {
      puVar7 = puVar5;
      puVar5 = puVar5 + 1;
    }
    *(undefined8 *)((long)pvVar2 + uVar4 * 8) = *puVar7;
  }
  return pmVar1;
}

Assistant:

mpc_parser_t *mpc_or(int n, ...) {

  int i;
  va_list va;

  mpc_parser_t *p = mpc_undefined();

  p->type = MPC_TYPE_OR;
  p->data.or.n = n;
  p->data.or.xs = malloc(sizeof(mpc_parser_t*) * n);

  va_start(va, n);
  for (i = 0; i < n; i++) {
    p->data.or.xs[i] = va_arg(va, mpc_parser_t*);
  }
  va_end(va);

  return p;
}